

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeIntError DivisionHelper<long,_int,_5>::Divide(long *t,int *u,long *result)

{
  long lVar1;
  SafeIntError SVar2;
  
  if ((long)*u == 0) {
    SVar2 = SafeIntDivideByZero;
  }
  else {
    SVar2 = SafeIntNoError;
    if (*t == 0) {
      lVar1 = 0;
    }
    else {
      lVar1 = *t / (long)*u;
    }
    *result = lVar1;
  }
  return SVar2;
}

Assistant:

static SafeIntError Divide( const T& t, const U& u, T& result ) SAFEINT_NOTHROW
    {
        if( u == 0 )
        {
            return SafeIntDivideByZero;
        }

        if( t == 0 )
        {
            result = 0;
            return SafeIntNoError;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            return SafeIntArithmeticOverflow;

        result = (T)( t/u );
        return SafeIntNoError;
    }